

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O2

void acutest_dump_(char *title,void *addr,size_t size)

{
  ulong uVar1;
  byte bVar2;
  size_t sVar3;
  ushort **ppuVar4;
  void *pvVar5;
  ulong uVar6;
  char *__format;
  ulong uVar7;
  uint __c;
  long lVar8;
  ulong uVar9;
  
  if (((1 < acutest_verbose_level_) && (acutest_current_test_ != (acutest_test_ *)0x0)) &&
     (acutest_cond_failed_ != 0)) {
    uVar9 = 0x400;
    if (size < 0x400) {
      uVar9 = size;
    }
    acutest_line_indent_(3 - (uint)(acutest_case_name_[0] == '\0'));
    sVar3 = strlen(title);
    __format = "%s:\n";
    if (title[sVar3 - 1] == ':') {
      __format = "%s\n";
    }
    printf(__format,title);
    pvVar5 = addr;
    uVar7 = 0;
    while (uVar7 < uVar9) {
      acutest_line_indent_(4 - (uint)(acutest_case_name_[0] == '\0'));
      printf("%08lx: ",uVar7);
      for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
        if (uVar7 + lVar8 < uVar9) {
          printf(" %02x",(ulong)*(byte *)((long)pvVar5 + lVar8));
        }
        else {
          printf("   ");
        }
      }
      uVar1 = uVar7 + 0x10;
      printf("  ");
      uVar6 = uVar9;
      if (uVar1 < uVar9) {
        uVar6 = uVar1;
      }
      for (; uVar7 < uVar6; uVar7 = uVar7 + 1) {
        bVar2 = *(byte *)((long)addr + uVar7);
        __c = (uint)bVar2;
        ppuVar4 = __ctype_b_loc();
        if (((*ppuVar4)[bVar2] & 2) != 0) {
          __c = 0x2e;
        }
        putchar(__c);
      }
      putchar(10);
      pvVar5 = (void *)((long)pvVar5 + 0x10);
      uVar7 = uVar1;
    }
    if (0x400 < size) {
      acutest_line_indent_(4 - (uint)(acutest_case_name_[0] == '\0'));
      printf("           ... (and more %u bytes)\n",(ulong)((int)size - 0x400));
      return;
    }
  }
  return;
}

Assistant:

void
acutest_dump_(const char* title, const void* addr, size_t size)
{
    static const size_t BYTES_PER_LINE = 16;
    size_t line_beg;
    size_t truncate = 0;

    if(acutest_verbose_level_ < 2)
        return;

    /* We allow extra message only when something is already wrong in the
     * current test. */
    if(acutest_current_test_ == NULL  ||  !acutest_cond_failed_)
        return;

    if(size > TEST_DUMP_MAXSIZE) {
        truncate = size - TEST_DUMP_MAXSIZE;
        size = TEST_DUMP_MAXSIZE;
    }

    acutest_line_indent_(acutest_case_name_[0] ? 3 : 2);
    printf((title[strlen(title)-1] == ':') ? "%s\n" : "%s:\n", title);

    for(line_beg = 0; line_beg < size; line_beg += BYTES_PER_LINE) {
        size_t line_end = line_beg + BYTES_PER_LINE;
        size_t off;

        acutest_line_indent_(acutest_case_name_[0] ? 4 : 3);
        printf("%08lx: ", (unsigned long)line_beg);
        for(off = line_beg; off < line_end; off++) {
            if(off < size)
                printf(" %02x", ((const unsigned char*)addr)[off]);
            else
                printf("   ");
        }

        printf("  ");
        for(off = line_beg; off < line_end; off++) {
            unsigned char byte = ((const unsigned char*)addr)[off];
            if(off < size)
                printf("%c", (iscntrl(byte) ? '.' : byte));
            else
                break;
        }

        printf("\n");
    }

    if(truncate > 0) {
        acutest_line_indent_(acutest_case_name_[0] ? 4 : 3);
        printf("           ... (and more %u bytes)\n", (unsigned) truncate);
    }
}